

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compoundfile_stream_and_dir.hpp
# Opt level: O2

void __thiscall CompoundFile::Stream::seek(Stream *this,int32_t pos,SeekType type)

{
  vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> *this_00;
  int iVar1;
  istream *piVar2;
  int32_t iVar3;
  reference pvVar4;
  int iVar5;
  int iVar6;
  SecID largeSector;
  SecID shortSector;
  SecID local_30;
  SecID local_2c;
  
  if (type == FromCurrent) {
    pos = pos + this->m_bytesReaded;
    if (pos < 0) {
      pos = pos + this->m_streamSize;
    }
    goto LAB_00103db1;
  }
  if (pos < 1 || type != FromEnd) {
    if (pos < 0 && type == FromEnd) {
      pos = -pos;
      goto LAB_00103db1;
    }
    if (type != FromBeginning || -1 < pos) goto LAB_00103db1;
  }
  pos = this->m_streamSize - pos;
LAB_00103db1:
  if (pos < this->m_streamSize) {
    iVar6 = pos / this->m_sectorSize;
    iVar5 = pos % this->m_sectorSize;
    this->m_bytesReaded = pos;
    this->m_sectorBytesReaded = iVar5;
    if (this->m_mode == LargeStream) {
      this->m_largeSecIDIdx = iVar6;
      iVar1 = (this->m_currentLargeSectorID).m_id;
      this_00 = &this->m_largeStreamChain;
      pvVar4 = std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>::at
                         (this_00,(long)iVar6);
      if (iVar1 != pvVar4->m_id) {
        pvVar4 = std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>::at
                           (this_00,(long)this->m_largeSecIDIdx);
        (this->m_currentLargeSectorID).m_id = pvVar4->m_id;
        piVar2 = this->m_stream;
        pvVar4 = std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>::at
                           (this_00,(long)this->m_largeSecIDIdx);
        std::istream::seekg((long)piVar2,pvVar4->m_id * this->m_sectorSize + 0x200);
        std::istream::read((char *)this->m_stream,
                           (long)(this->m_buf).super__Vector_base<char,_std::allocator<char>_>.
                                 _M_impl.super__Vector_impl_data._M_start);
      }
      this->m_pos = iVar5;
    }
    else {
      pvVar4 = std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>::at
                         (&this->m_shortStreamChain,(long)iVar6);
      local_2c.m_id = pvVar4->m_id;
      local_30.m_id = -2;
      iVar3 = whereIsShortSector(this,&local_2c,&local_30);
      this->m_shortSecIDIdx = iVar6;
      if ((this->m_currentLargeSectorID).m_id != local_30.m_id) {
        (this->m_currentLargeSectorID).m_id = local_30.m_id;
        std::istream::seekg((long)this->m_stream,
                            this->m_header->m_sectorSize * local_30.m_id + 0x200);
        std::istream::read((char *)this->m_stream,
                           (long)(this->m_buf).super__Vector_base<char,_std::allocator<char>_>.
                                 _M_impl.super__Vector_impl_data._M_start);
      }
      this->m_pos = iVar3 * this->m_header->m_shortSectorSize + iVar5;
    }
  }
  else {
    this->m_bytesReaded = this->m_streamSize;
  }
  return;
}

Assistant:

inline void
Stream::seek( int32_t pos, SeekType type )
{
	if( type == FromCurrent )
	{
		pos += m_bytesReaded;

		if( pos < 0 )
			pos += m_streamSize;
	}
	else if( type == FromEnd && pos > 0 )
		pos = m_streamSize - pos;
	else if( type == FromEnd && pos < 0 )
		pos = std::abs( pos );
	else if( type == FromBeginning && pos < 0 )
		pos = m_streamSize - pos;

	if( pos >= m_streamSize )
	{
		m_bytesReaded = m_streamSize;
		return;
	}

	const int32_t offset = pos % m_sectorSize;
	const int32_t sectorIdx = pos / m_sectorSize;

	m_bytesReaded = pos;
	m_sectorBytesReaded = offset;

	if( m_mode == LargeStream )
	{
		m_largeSecIDIdx = sectorIdx;

		if( m_currentLargeSectorID != m_largeStreamChain.at( m_largeSecIDIdx ) )
		{
			m_currentLargeSectorID = m_largeStreamChain.at( m_largeSecIDIdx );

			m_stream.seekg( calcFileOffset( m_largeStreamChain.at( m_largeSecIDIdx ),
				m_sectorSize ), std::ios::beg );

			m_stream.read( &m_buf[ 0 ], m_sectorSize );
		}

		m_pos = offset;
	}
	else
	{
		const SecID shortSector = m_shortStreamChain.at( sectorIdx );

		SecID largeSector;
		const int32_t offsetInLargeSector = whereIsShortSector( shortSector,
			largeSector );

		m_shortSecIDIdx = sectorIdx;

		if( m_currentLargeSectorID != largeSector )
		{
			m_currentLargeSectorID = largeSector;

			std::streampos pos = calcFileOffset( largeSector,
				m_header.sectorSize() );

			m_stream.seekg( pos, std::ios::beg );

			m_stream.read( &m_buf[ 0 ], m_header.sectorSize() );
		}

		m_pos = offsetInLargeSector * m_header.shortSectorSize();
		m_pos += offset;
	}
}